

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O0

ssize_t __thiscall QGifHandler::read(QGifHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  int decoded;
  int GifChunkSize;
  int *in_stack_000000a8;
  int *in_stack_000000b0;
  int in_stack_000000bc;
  uchar *in_stack_000000c0;
  QImage *in_stack_000000c8;
  QGIFFormat *in_stack_000000d0;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  QGIFFormat *in_stack_ffffffffffffffa0;
  undefined1 local_21;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  while (((this->gifFormat->newFrame ^ 0xffU) & 1) != 0) {
    bVar1 = QByteArray::isEmpty((QByteArray *)0x1080c6);
    if (bVar1) {
      QImageIOHandler::device();
      QIODevice::read((longlong)local_20);
      QByteArray::operator+=
                ((QByteArray *)in_stack_ffffffffffffffa0,
                 (QByteArray *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      QByteArray::~QByteArray((QByteArray *)0x108105);
      bVar1 = QByteArray::isEmpty((QByteArray *)0x108113);
      if (bVar1) break;
    }
    in_stack_ffffffffffffffa0 = this->gifFormat;
    QByteArray::constData((QByteArray *)0x108143);
    QByteArray::size(&this->buffer);
    iVar2 = QGIFFormat::decode(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                               in_stack_000000bc,in_stack_000000b0,in_stack_000000a8);
    if (iVar2 == -1) break;
    QByteArray::remove((longlong)&this->buffer,0);
  }
  if ((this->gifFormat->newFrame & 1U) == 0) {
    if ((this->gifFormat->partialNewFrame & 1U) != 0) {
      plVar3 = (long *)QImageIOHandler::device();
      uVar4 = (**(code **)(*plVar3 + 0x90))();
      if ((uVar4 & 1) != 0) goto LAB_001081de;
    }
    local_21 = 0;
  }
  else {
LAB_001081de:
    QImage::operator=((QImage *)CONCAT44(in_register_00000034,__fd),&this->lastImage);
    this->frameNumber = this->frameNumber + 1;
    this->gifFormat->newFrame = false;
    this->gifFormat->partialNewFrame = false;
    local_21 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_21);
}

Assistant:

bool QGifHandler::read(QImage *image)
{
    const int GifChunkSize = 4096;

    while (!gifFormat->newFrame) {
        if (buffer.isEmpty()) {
            buffer += device()->read(GifChunkSize);
            if (buffer.isEmpty())
                break;
        }

        int decoded = gifFormat->decode(&lastImage, (const uchar *)buffer.constData(), buffer.size(),
                                        &nextDelay, &loopCnt);
        if (decoded == -1)
            break;
        buffer.remove(0, decoded);
    }
    if (gifFormat->newFrame || (gifFormat->partialNewFrame && device()->atEnd())) {
        *image = lastImage;
        ++frameNumber;
        gifFormat->newFrame = false;
        gifFormat->partialNewFrame = false;
        return true;
    }

    return false;
}